

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O2

void process_ack(NMQ *q,uint32_t sn,uint32_t ts_send)

{
  uint64_t *puVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  ulong uVar5;
  int64_t iVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  segment *s;
  
  uVar2 = q->snd_una;
  uVar5 = (ulong)(q->MAX_SND_BUF_NUM + sn) % (ulong)q->MAX_SND_BUF_NUM;
  if (((uVar2 <= sn) && (uVar3 = q->snd_nxt, sn < uVar3)) &&
     (s = (segment *)q->snd_sn_to_node[uVar5], s != (segment *)0x0)) {
    if ((ts_send != 0) && (s->sendts == ts_send)) {
      uVar4 = q->current;
      uVar7 = (q->rto_helper).srtt;
      (q->stat).nrtt = (q->stat).nrtt + 1;
      uVar10 = uVar4 - ts_send;
      puVar1 = &(q->stat).nrtt_tot;
      *puVar1 = *puVar1 + (ulong)uVar10;
      uVar10 = uVar10 + (uVar10 == 0);
      if (uVar7 == 0) {
        (q->rto_helper).srtt = uVar10 * 8;
        (q->rto_helper).mdev = uVar10 * 2;
        iVar6 = MAX((ulong)(uVar10 * 2),100);
        (q->rto_helper).mdev_max = (uint32_t)iVar6;
        (q->rto_helper).rttvar = (uint32_t)iVar6;
        (q->rto_helper).rtt_seq = q->snd_nxt;
        s = (segment *)q->snd_sn_to_node[uVar5];
      }
      else {
        lVar8 = (ulong)uVar10 - (ulong)(uVar7 >> 3);
        (q->rto_helper).srtt = (int)lVar8 + uVar7;
        uVar7 = (q->rto_helper).mdev;
        uVar10 = uVar7 >> 2;
        if (lVar8 < 0) {
          lVar8 = lVar8 + (ulong)uVar10;
          uVar11 = -lVar8;
          iVar9 = (int)(uVar11 >> 3);
          if (-1 < lVar8) {
            iVar9 = (int)uVar11;
          }
        }
        else {
          iVar9 = (int)lVar8 - uVar10;
        }
        uVar7 = uVar7 + iVar9;
        (q->rto_helper).mdev = uVar7;
        uVar10 = (q->rto_helper).mdev_max;
        if ((uVar10 < uVar7) &&
           ((q->rto_helper).mdev_max = uVar7, uVar10 = uVar7, (q->rto_helper).rttvar < uVar7)) {
          (q->rto_helper).rttvar = uVar7;
        }
        if ((q->rto_helper).rtt_seq < uVar2) {
          uVar2 = (q->rto_helper).rttvar;
          if (uVar10 <= uVar2 && uVar2 - uVar10 != 0) {
            (q->rto_helper).rttvar = uVar2 - (uVar2 - uVar10 >> 2);
          }
          (q->rto_helper).rtt_seq = uVar3;
          (q->rto_helper).mdev_max = 100;
        }
      }
    }
    dlist_remove_node(&s->head);
    q->snd_sn_to_node[uVar5] = (dlnode *)0x0;
    recycle_segment(&q->pool,s);
    return;
  }
  return;
}

Assistant:

static void process_ack(NMQ *q, uint32_t sn, uint32_t ts_send) {
    uint32_t sn_mod = modsn(sn, q->MAX_SND_BUF_NUM);
    if (sn < q->snd_una || sn >= q->snd_nxt || !q->snd_sn_to_node[sn_mod]) { // sn 0 is valid!!!
        return;
    }
    if (ts_send) {  //  during processing una. just delete segments and do nothing
        update_rtt(q, sn, ts_send);
    }

    dlnode *node = q->snd_sn_to_node[sn_mod];
    dlist_remove_node(node);

    q->snd_sn_to_node[sn_mod] = NULL;
    segment *s = ADDRESS_FOR(segment, head, node);
    recycle_segment(&q->pool, s);
}